

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  PyTypeObject *type;
  anon_union_24_2_63b86169_for_instance_1 *paVar1;
  undefined1 local_138 [8];
  values_and_holders vhs;
  undefined1 local_108 [8];
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_32;
  allocator local_31;
  
  if ((find_type == (type_info *)0x0) || (type = (this->ob_base).ob_type, type == find_type->type))
  {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
    if ((this->field_0x30 & 2) == 0) {
      paVar1 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
    }
    else {
      paVar1 = &this->field_1;
    }
    __return_storage_ptr__->vh = (void **)paVar1;
  }
  else {
    local_138 = (undefined1  [8])this;
    vhs.inst = (instance *)all_type_info(type);
    values_and_holders::find((iterator *)local_108,(values_and_holders *)local_138,find_type);
    if (CONCAT44(it.curr.inst._4_4_,it.curr.inst._0_4_) ==
        (long)((vhs.inst)->ob_base).ob_type - ((vhs.inst)->ob_base).ob_refcnt >> 3) {
      if (throw_if_missing) {
        std::__cxx11::string::string((string *)&vhs.tinfo,find_type->type->tp_name,&local_32);
        std::operator+(&local_78,"pybind11::detail::instance::get_value_and_holder: `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vhs.tinfo);
        std::operator+(&local_98,&local_78,"\' is not a pybind11 base of the given `");
        std::__cxx11::string::string
                  ((string *)&local_58,((this->ob_base).ob_type)->tp_name,&local_31);
        std::operator+(&local_b8,&local_98,&local_58);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &it.curr.vh,&local_b8,"\' instance");
        pybind11_fail((string *)&it.curr.vh);
      }
      it.types._0_4_ = 0;
      it.types._4_4_ = 0;
      it.curr.inst._0_4_ = 0;
      it.curr.inst._4_4_ = 0;
      __return_storage_ptr__->type = (type_info *)0x0;
      __return_storage_ptr__->vh = (void **)0x0;
    }
    else {
      __return_storage_ptr__->type = (type_info *)it.curr.index;
      __return_storage_ptr__->vh = &(it.curr.type)->type;
    }
    *(undefined4 *)&__return_storage_ptr__->inst = it.types._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->inst + 4) = it.types._4_4_;
    *(undefined4 *)&__return_storage_ptr__->index = it.curr.inst._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->index + 4) = it.curr.inst._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/, bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

    if (!throw_if_missing)
        return value_and_holder();

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            std::string(find_type->type->tp_name) + "' is not a pybind11 base of the given `" +
            std::string(Py_TYPE(this)->tp_name) + "' instance");
#endif
}